

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_0::HeapTypeInfo::~HeapTypeInfo(HeapTypeInfo *this)

{
  HeapTypeInfo *this_local;
  
  switch(this->kind) {
  case Basic:
  default:
    handle_unreachable("unexpected kind",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x1e4);
  case Func:
    break;
  case Struct:
    Struct::~Struct(&(this->field_9).struct_);
    break;
  case Array:
    break;
  case Cont:
  }
  return;
}

Assistant:

HeapTypeInfo::~HeapTypeInfo() {
  switch (kind) {
    case HeapTypeKind::Func:
      signature.~Signature();
      return;
    case HeapTypeKind::Cont:
      continuation.~Continuation();
      return;
    case HeapTypeKind::Struct:
      struct_.~Struct();
      return;
    case HeapTypeKind::Array:
      array.~Array();
      return;
    case HeapTypeKind::Basic:
      break;
  }
  WASM_UNREACHABLE("unexpected kind");
}